

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

void gc_twist_log(gc_twist *xd)

{
  gc_twist *xd_local;
  
  if (xd == (gc_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x103,"void gc_twist_log(const struct gc_twist *)");
  }
  if ((xd->angular_velocity != (vector3 *)0x0) && (xd->linear_velocity != (vector3 *)0x0)) {
    printf("TwistCoord(angular=[%5.2f, %5.2f, %5.2f],\n",(xd->angular_velocity->field_0).field_0.x,
           (xd->angular_velocity->field_0).field_0.y,(xd->angular_velocity->field_0).field_0.z);
    printf("           linear =[%5.2f, %5.2f, %5.2f])\n",(xd->linear_velocity->field_0).field_0.x,
           (xd->linear_velocity->field_0).field_0.y,(xd->linear_velocity->field_0).field_0.z);
    return;
  }
  __assert_fail("xd->angular_velocity && xd->linear_velocity",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x104,"void gc_twist_log(const struct gc_twist *)");
}

Assistant:

void gc_twist_log(
        const struct gc_twist *xd)
{
    assert(xd);
    assert(xd->angular_velocity && xd->linear_velocity);

    printf("TwistCoord(angular=[%5.2f, %5.2f, %5.2f],\n",
            xd->angular_velocity->x,
            xd->angular_velocity->y,
            xd->angular_velocity->z);
    printf("           linear =[%5.2f, %5.2f, %5.2f])\n",
            xd->linear_velocity->x,
            xd->linear_velocity->y,
            xd->linear_velocity->z);
}